

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

TSentences * __thiscall
NJamSpell::TTokenizer::Process
          (TSentences *__return_storage_ptr__,TTokenizer *this,wstring *originalText)

{
  wchar_t wVar1;
  size_type sVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  uint uVar6;
  ctype *pcVar7;
  __node_base_ptr p_Var8;
  ulong uVar9;
  ulong uVar10;
  __node_base_ptr p_Var11;
  TWord local_58;
  undefined1 auStack_48 [8];
  TWords currSentence;
  
  sVar2 = originalText->_M_string_length;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sVar2 != 0) {
    auStack_48 = (undefined1  [8])0x0;
    currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.Ptr = (pointer)0x0;
    local_58.Len = 0;
    if (originalText->_M_string_length != 0) {
      uVar10 = 0;
      do {
        wVar1 = (originalText->_M_dataplus)._M_p[uVar10];
        pcVar7 = std::use_facet<std::ctype<wchar_t>>(&this->Locale);
        uVar6 = (**(code **)(*(long *)pcVar7 + 0x40))(pcVar7,wVar1);
        uVar3 = (this->Alphabet)._M_h._M_bucket_count;
        uVar9 = (ulong)(long)(int)uVar6 % uVar3;
        p_Var4 = (this->Alphabet)._M_h._M_buckets[uVar9];
        p_Var8 = (__node_base_ptr)0x0;
        if ((p_Var4 != (__node_base_ptr)0x0) &&
           (p_Var8 = p_Var4, p_Var11 = p_Var4->_M_nxt, uVar6 != *(uint *)&p_Var4->_M_nxt[1]._M_nxt))
        {
          while (p_Var5 = p_Var11->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
            p_Var8 = (__node_base_ptr)0x0;
            if (((ulong)(long)(int)*(uint *)&p_Var5[1]._M_nxt % uVar3 != uVar9) ||
               (p_Var8 = p_Var11, p_Var11 = p_Var5, uVar6 == *(uint *)&p_Var5[1]._M_nxt))
            goto LAB_0012edca;
          }
          p_Var8 = (__node_base_ptr)0x0;
        }
LAB_0012edca:
        if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
          if (local_58.Ptr != (pointer)0x0) {
            if (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
              _M_realloc_insert<NJamSpell::TWord_const&>
                        ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)auStack_48,
                         (iterator)
                         currSentence.
                         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_58);
            }
            else {
              (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
               _M_impl.super__Vector_impl_data._M_start)->Ptr = local_58.Ptr;
              (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
               _M_impl.super__Vector_impl_data._M_start)->Len = local_58.Len;
              currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   currSentence.
                   super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            local_58.Ptr = (pointer)0x0;
            local_58.Len = 0;
          }
        }
        else {
          if (local_58.Ptr == (pointer)0x0) {
            local_58.Ptr = (originalText->_M_dataplus)._M_p + uVar10;
          }
          local_58.Len = local_58.Len + 1;
        }
        if ((((uVar6 < 0x40) && ((0x8000400200000000U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) &&
            (auStack_48 !=
             (undefined1  [8])
             currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
             _M_impl.super__Vector_impl_data._M_start)) &&
           (std::
            vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
            ::push_back(__return_storage_ptr__,(value_type *)auStack_48),
           (undefined1  [8])
           currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
           _M_impl.super__Vector_impl_data._M_start != auStack_48)) {
          currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_48;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < originalText->_M_string_length);
    }
    if (local_58.Ptr != (pointer)0x0) {
      if (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
        _M_realloc_insert<NJamSpell::TWord_const&>
                  ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)auStack_48,
                   (iterator)
                   currSentence.
                   super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_58);
      }
      else {
        (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
         _M_impl.super__Vector_impl_data._M_start)->Ptr = local_58.Ptr;
        (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
         _M_impl.super__Vector_impl_data._M_start)->Len = local_58.Len;
        currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_start =
             currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    if (auStack_48 !=
        (undefined1  [8])
        currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::
      vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)auStack_48);
    }
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TSentences TTokenizer::Process(const std::wstring& originalText) const {
    if (originalText.empty()) {
        return TSentences();
    }

    TSentences sentences;

    TWords currSentence;
    TWord currWord;

    for (size_t i = 0; i < originalText.size(); ++i) {
        wchar_t letter = std::tolower(originalText[i], Locale);
        if (Alphabet.find(letter) != Alphabet.end()) {
            if (currWord.Ptr == nullptr) {
                currWord.Ptr = &originalText[i];
            }
            currWord.Len += 1;
        } else {
            if (currWord.Ptr != nullptr) {
                currSentence.push_back(currWord);
                currWord = TWord();
            }
        }
        if (letter == L'?' || letter == L'!' || letter == L'.') {
            if (!currSentence.empty()) {
                sentences.push_back(currSentence);
                currSentence.clear();
            }
        }
    }
    if (currWord.Ptr != nullptr) {
        currSentence.push_back(currWord);
    }
    if (!currSentence.empty()) {
        sentences.push_back(currSentence);
    }

    return sentences;
}